

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::AsyncCapabilityStream::ReadResult> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedWrite::tryReadWithFds
          (BlockedWrite *this,void *buffer,size_t minBytes,size_t maxBytes,OwnFd *fdBuffer,
          size_t maxFds)

{
  _func_int *p_Var1;
  bool bVar2;
  int iVar3;
  int osErrorNumber;
  void *pvVar4;
  ArrayDisposer *pAVar5;
  size_t extraout_RDX;
  size_t minBytes_00;
  Context *pCVar6;
  SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:542:21)>
  *location;
  Disposer *pDVar7;
  Context *pCVar8;
  Exception *pEVar9;
  PromiseBase PVar10;
  FixVoid<kj::AsyncCapabilityStream::ReadResult> value;
  void *continuationTracePtr;
  Fault f;
  code *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [40];
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  Disposer *local_58;
  ArrayDisposer *local_50;
  Disposer *local_48;
  undefined1 local_40 [16];
  
  local_98._8_8_ = this;
  local_58 = (Disposer *)minBytes;
  local_50 = (ArrayDisposer *)maxBytes;
  local_48 = (Disposer *)fdBuffer;
  if (*(int *)((long)buffer + 0x40) == 2) {
    pCVar8 = (Context *)0x0;
    if ((continuationTracePtr != (void *)0x0) && (*(long *)((long)buffer + 0x50) != 0)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[130]>
                ((Fault *)local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x20d,FAILED,(char *)0x0,
                 "\"async pipe message was written with streams attached, but corresponding read \" \"asked for FDs, and we don\'t know how to convert here\""
                 ,(char (*) [130])
                  "async pipe message was written with streams attached, but corresponding read asked for FDs, and we don\'t know how to convert here"
                );
      kj::_::Debug::Fault::fatal((Fault *)local_88);
    }
  }
  else if (*(int *)((long)buffer + 0x40) == 1) {
    pCVar8 = (Context *)0x0;
    bVar2 = false;
    while (!bVar2) {
      pCVar8 = *(Context **)((long)buffer + 0x50);
      if (*(Context **)((long)buffer + 0x50) <= continuationTracePtr) {
        pCVar8 = (Context *)continuationTracePtr;
      }
      local_40._0_8_ = continuationTracePtr;
      for (pCVar6 = (Context *)0x0; pCVar6 != pCVar8; pCVar6 = (Context *)((long)&pCVar6->file + 1))
      {
        do {
          iVar3 = dup(*(int *)(*(long *)((long)buffer + 0x48) + (long)pCVar6 * 4));
          if (-1 < iVar3) goto LAB_00374616;
          osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
        } while (osErrorNumber == -1);
        if (osErrorNumber != 0) {
          kj::_::Debug::Fault::Fault
                    ((Fault *)local_88,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                     ,0x202,osErrorNumber,"_kj_fd = dup(fds[i])","");
          kj::_::Debug::Fault::fatal((Fault *)local_88);
        }
LAB_00374616:
        local_a0 = (code *)CONCAT44(local_a0._4_4_,iVar3);
        OwnFd::operator=((OwnFd *)(maxFds + (long)pCVar6 * 4),(OwnFd *)&local_a0);
        OwnFd::~OwnFd((OwnFd *)&local_a0);
      }
      maxFds = maxFds + (long)pCVar8 * 4;
      continuationTracePtr = (void *)(local_40._0_8_ - (long)pCVar8);
      bVar2 = true;
    }
  }
  else {
    pCVar8 = (Context *)0x0;
  }
  local_88._0_8_ = (ulong)(uint)local_88._4_4_ << 0x20;
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::
  operator=((OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
             *)((long)buffer + 0x40),
            (OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
             *)local_88);
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::
  ~OneOf((OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
          *)local_88);
  pAVar5 = local_50;
  pDVar7 = local_48;
  tryReadImpl((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
               *)local_88,(BlockedWrite *)buffer,local_58,(size_t)local_50,(size_t)local_48);
  PVar10.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_98._8_8_;
  minBytes_00 = local_88._8_8_;
  pEVar9 = (Exception *)local_88._32_8_;
  if ((local_88._0_4_ != 2) &&
     (local_88._16_8_ = pAVar5, minBytes_00 = extraout_RDX, local_88._24_8_ = pDVar7,
     pEVar9 = (Exception *)local_88, local_88._0_4_ == 1)) {
    minBytes_00 = local_88._8_8_;
  }
  if (local_88._0_4_ == 1) {
    value.capCount = (size_t)pCVar8;
    value.byteCount = minBytes_00;
    Promise<kj::AsyncCapabilityStream::ReadResult>::Promise
              ((Promise<kj::AsyncCapabilityStream::ReadResult> *)local_98._8_8_,value);
  }
  else {
    if (local_88._0_4_ != 2) {
      kj::_::unreachable();
    }
    AsyncPipe::tryReadWithFds
              ((AsyncPipe *)local_98,*(void **)((long)buffer + 0x18),minBytes_00,local_88._16_8_,
               (OwnFd *)local_88._24_8_,maxFds);
    local_a0 = kj::_::
               SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:542:21)>
               ::anon_class_16_2_23ff280d_for_func::operator();
    p_Var1 = *(_func_int **)(local_98._0_8_ + 8);
    local_88._0_8_ = pEVar9;
    local_88._8_8_ = pCVar8;
    if (p_Var1 == (_func_int *)0x0 || (ulong)(local_98._0_8_ - (long)p_Var1) < 0x30) {
      pvVar4 = operator_new(0x400);
      location = (SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:542:21)>
                  *)((long)pvVar4 + 0x3d0);
      ctor<kj::_::SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::tryReadWithFds(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long)::_lambda(kj::AsyncCapabilityStream::ReadResult)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::tryReadWithFds(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long)::_lambda(kj::AsyncCapabilityStream::ReadResult)_1_,void*&>
                (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_98,
                 (anon_class_16_2_23ff280d_for_func *)local_88,&local_a0);
      *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
    }
    else {
      *(_func_int **)(local_98._0_8_ + 8) = (_func_int *)0x0;
      location = (SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:542:21)>
                  *)(local_98._0_8_ + -0x30);
      ctor<kj::_::SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::tryReadWithFds(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long)::_lambda(kj::AsyncCapabilityStream::ReadResult)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::tryReadWithFds(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long)::_lambda(kj::AsyncCapabilityStream::ReadResult)_1_,void*&>
                (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_98,
                 (anon_class_16_2_23ff280d_for_func *)local_88,&local_a0);
      *(_func_int **)(local_98._0_8_ + -0x28) = p_Var1;
    }
    PVar10.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_98._8_8_;
    local_60.ptr = (PromiseNode *)0x0;
    *(SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:542:21)>
      **)local_98._8_8_ = location;
    local_40._8_8_ = (ForkHub<kj::_::Void> *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_40 + 8));
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_98);
  }
  return (Promise<kj::AsyncCapabilityStream::ReadResult>)(PromiseNode *)PVar10.node.ptr;
}

Assistant:

Promise<ReadResult> tryReadWithFds(void* buffer, size_t minBytes, size_t maxBytes,
                                       OwnFd* fdBuffer, size_t maxFds) override {
      size_t capCount = 0;
      {  // TODO(cleanup): Remove redundant braces when we update to C++17.
        KJ_SWITCH_ONEOF(capBuffer) {
          KJ_CASE_ONEOF(fds, ArrayPtr<const int>) {
            capCount = kj::max(fds.size(), maxFds);
            // Unfortunately, we have to dup() each FD, because the writer doesn't release ownership
            // by default.
            // TODO(perf): Should we add an ownership-releasing version of writeWithFds()?
            for (auto i: kj::zeroTo(capCount)) {
              fdBuffer[i] = KJ_SYSCALL_FD(dup(fds[i]));
            }
            fdBuffer += capCount;
            maxFds -= capCount;
          }
          KJ_CASE_ONEOF(streams, Array<Own<AsyncCapabilityStream>>) {
            if (streams.size() > 0 && maxFds > 0) {
              // TODO(someday): We could let people pass a LowLevelAsyncIoProvider to
              //   newTwoWayPipe() if we wanted to auto-wrap FDs, but does anyone care?
              KJ_FAIL_REQUIRE(
                  "async pipe message was written with streams attached, but corresponding read "
                  "asked for FDs, and we don't know how to convert here");
            }
          }
        }
      }

      // Drop any unclaimed caps. This mirrors the behavior of unix sockets, where if we didn't
      // provide enough buffer space for all the written FDs, the remaining ones are lost.
      capBuffer = {};

      KJ_SWITCH_ONEOF(tryReadImpl(buffer, minBytes, maxBytes)) {
        KJ_CASE_ONEOF(done, Done) {
          return ReadResult { done.result, capCount };
        }
        KJ_CASE_ONEOF(retry, Retry) {
          return pipe.tryReadWithFds(
              retry.buffer, retry.minBytes, retry.maxBytes, fdBuffer, maxFds)
              .then([byteCount = retry.alreadyRead, capCount](ReadResult result) {
            result.byteCount += byteCount;
            result.capCount += capCount;
            return result;
          });
        }
      }
      KJ_UNREACHABLE;
    }